

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

void uv_walk(uv_loop_t *loop,uv_walk_cb walk_cb,void *arg)

{
  undefined8 *puVar1;
  
  for (puVar1 = (undefined8 *)loop->handle_queue[0]; (void **)puVar1 != loop->handle_queue;
      puVar1 = (undefined8 *)*puVar1) {
    if ((*(byte *)((long)puVar1 + 0x11) & 0x80) == 0) {
      (*walk_cb)((uv_handle_t *)(puVar1 + -4),arg);
    }
  }
  return;
}

Assistant:

void uv_walk(uv_loop_t* loop, uv_walk_cb walk_cb, void* arg) {
  QUEUE* q;
  uv_handle_t* h;

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);
    if (h->flags & UV__HANDLE_INTERNAL) continue;
    walk_cb(h, arg);
  }
}